

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void GA_Set_restricted(int g_a,int *list,int size)

{
  Integer *list_00;
  ulong uVar1;
  
  list_00 = (Integer *)malloc((long)size * 8);
  if (0 < size) {
    uVar1 = 0;
    do {
      list_00[uVar1] = (long)list[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)size != uVar1);
  }
  pnga_set_restricted((long)g_a,list_00,(long)size);
  free(list_00);
  return;
}

Assistant:

void GA_Set_restricted(int g_a, int list[], int size)
{
    Integer aa;
    Integer asize = (Integer)size;
    int i;
    Integer *_ga_map_capi;
    aa = (Integer)g_a;
    _ga_map_capi = (Integer*)malloc(size * sizeof(Integer));
    for (i=0; i<size; i++)
       _ga_map_capi[i] = (Integer)list[i];
    wnga_set_restricted(aa,_ga_map_capi,asize);
    free(_ga_map_capi);
}